

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs::function&>(holder<cs::callable> *this,function *args)

{
  undefined8 local_30;
  undefined8 uStack_28;
  _Manager_type local_20;
  _Invoker_type local_18;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_003238d8;
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs::function&,void>
            ((function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)> *)
             &local_30,args);
  *(undefined8 *)&(this->mDat).mFunc.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = 0;
  (this->mDat).mFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).mFunc._M_invoker = local_18;
  if (local_20 != (_Manager_type)0x0) {
    *(undefined8 *)&(this->mDat).mFunc.super__Function_base._M_functor = local_30;
    *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = uStack_28;
    (this->mDat).mFunc.super__Function_base._M_manager = local_20;
  }
  (this->mDat).mType = normal;
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}